

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack10_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar2 = *(ulong *)in;
  auVar7._8_4_ = 0x3ff;
  auVar7._0_8_ = 0x3ff000003ff;
  auVar7._12_4_ = 0x3ff;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6 = vpshufd_avx(auVar6,0x40);
  auVar4 = vpsrlvd_avx2(auVar6,_DAT_0019d810);
  *out = (uint)uVar2 & 0x3ff;
  uVar5 = (uint)(uVar2 >> 0x20);
  auVar3 = vpinsrd_avx(auVar7,(uVar5 & 0xff) << 2,2);
  auVar6 = vpand_avx(auVar4,auVar7);
  auVar3 = vpor_avx(auVar4,auVar3);
  auVar6 = vpblendd_avx2(auVar6,auVar3,4);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  out[5] = uVar5 >> 0x12 & 0x3ff;
  uVar1 = in[2];
  out[6] = uVar5 >> 0x1c | (uVar1 & 0x3f) << 4;
  out[7] = uVar1 >> 6 & 0x3ff;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack10_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;

  return in + 1;
}